

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_avs2d_rkv.c
# Opt level: O0

RK_U8 fetch_data(RK_U32 fmt,RK_U8 *line,RK_U32 num)

{
  sbyte sVar1;
  RK_U8 local_24;
  RK_U32 value;
  RK_U32 offset;
  RK_U32 num_local;
  RK_U8 *line_local;
  RK_U32 fmt_local;
  
  local_24 = '\0';
  if (fmt == 1) {
    sVar1 = (sbyte)((num & 3) << 1);
    local_24 = (RK_U8)((((int)(uint)line[num * 10 >> 3] >> sVar1 |
                        (uint)line[(num * 10 >> 3) + 1] << (8U - sVar1 & 0x1f)) & 0x3ff) >> 2);
  }
  else if (fmt == 0) {
    local_24 = line[num];
  }
  return local_24;
}

Assistant:

static RK_U8 fetch_data(RK_U32 fmt, RK_U8 *line, RK_U32 num)
{
    RK_U32 offset = 0;
    RK_U32 value = 0;

    if (fmt == MPP_FMT_YUV420SP_10BIT) {
        offset = (num * 2) & 7;
        value = (line[num * 10 / 8] >> offset) |
                (line[num * 10 / 8 + 1] << (8 - offset));

        value = (value & 0x3ff) >> 2;
    } else if (fmt == MPP_FMT_YUV420SP) {
        value = line[num];
    }

    return value;
}